

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

int traverseephemeron(global_State *g,Table *h)

{
  byte bVar1;
  Node *pNVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint local_3c;
  uint i;
  Node *limit;
  Node *n;
  int hasww;
  int hasclears;
  int marked;
  Table *h_local;
  global_State *g_local;
  
  hasww = 0;
  bVar4 = false;
  bVar3 = false;
  pNVar2 = h->node;
  bVar1 = h->lsizenode;
  for (local_3c = 0; local_3c < h->sizearray; local_3c = local_3c + 1) {
    if (((h->array[local_3c].tt_ & 0x40U) != 0) &&
       (((h->array[local_3c].value_.gc)->marked & 3) != 0)) {
      hasww = 1;
      reallymarkobject(g,h->array[local_3c].value_.gc);
    }
  }
  for (limit = h->node; limit < pNVar2 + (1 << (bVar1 & 0x1f)); limit = limit + 1) {
    if ((limit->i_val).tt_ == 0) {
      removeentry(limit);
    }
    else {
      iVar5 = iscleared(g,&(limit->i_key).tvk);
      if (iVar5 == 0) {
        if ((((limit->i_val).tt_ & 0x40U) != 0) && ((((limit->i_val).value_.gc)->marked & 3) != 0))
        {
          hasww = 1;
          reallymarkobject(g,(limit->i_val).value_.gc);
        }
      }
      else {
        bVar4 = true;
        if ((((limit->i_val).tt_ & 0x40U) != 0) && ((((limit->i_val).value_.gc)->marked & 3) != 0))
        {
          bVar3 = true;
        }
      }
    }
  }
  if (g->gcstate == '\0') {
    h->gclist = g->grayagain;
    g->grayagain = (GCObject *)h;
  }
  else if (bVar3) {
    h->gclist = g->ephemeron;
    g->ephemeron = (GCObject *)h;
  }
  else if (bVar4) {
    h->gclist = g->allweak;
    g->allweak = (GCObject *)h;
  }
  return hasww;
}

Assistant:

static int traverseephemeron (global_State *g, Table *h) {
  int marked = 0;  /* true if an object is marked in this traversal */
  int hasclears = 0;  /* true if table has white keys */
  int hasww = 0;  /* true if table has entry "white-key -> white-value" */
  Node *n, *limit = gnodelast(h);
  unsigned int i;
  /* traverse array part */
  for (i = 0; i < h->sizearray; i++) {
    if (valiswhite(&h->array[i])) {
      marked = 1;
      reallymarkobject(g, gcvalue(&h->array[i]));
    }
  }
  /* traverse hash part */
  for (n = gnode(h, 0); n < limit; n++) {
    checkdeadkey(n);
    if (ttisnil(gval(n)))  /* entry is empty? */
      removeentry(n);  /* remove it */
    else if (iscleared(g, gkey(n))) {  /* key is not marked (yet)? */
      hasclears = 1;  /* table must be cleared */
      if (valiswhite(gval(n)))  /* value not marked yet? */
        hasww = 1;  /* white-white entry */
    }
    else if (valiswhite(gval(n))) {  /* value not marked yet? */
      marked = 1;
      reallymarkobject(g, gcvalue(gval(n)));  /* mark it now */
    }
  }
  /* link table into proper list */
  if (g->gcstate == GCSpropagate)
    linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
  else if (hasww)  /* table has white->white entries? */
    linkgclist(h, g->ephemeron);  /* have to propagate again */
  else if (hasclears)  /* table has white keys? */
    linkgclist(h, g->allweak);  /* may have to clean white keys */
  return marked;
}